

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_conserved_exp_entropy_ark.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  N_Vector y;
  double *pdVar3;
  N_Vector p_Var4;
  double *pdVar5;
  long lVar6;
  FILE *__s;
  void *user_data;
  void *user_data_00;
  code *pcVar7;
  char *pcVar8;
  code *pcVar9;
  char cVar10;
  undefined4 uVar11;
  undefined8 unaff_R12;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  sunrealtype t;
  SUNContext ctx;
  long nst;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nrnlsf;
  long nrnlsi;
  long nrje;
  long nre;
  long nrbf;
  long nrf;
  long nfi;
  long nfe;
  long nst_a;
  sunrealtype ent;
  sunrealtype ent0;
  long local_128;
  double local_120;
  double local_118;
  undefined8 local_110;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  double local_f0;
  N_Vector local_e8;
  long local_e0;
  ulong local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  uVar12 = 0;
  local_110 = 0;
  local_128 = 0;
  if (1 < argc) {
    iVar1 = atoi(argv[1]);
    uVar12 = (ulong)(iVar1 == 0);
  }
  if (argc < 3) {
    uVar11 = 0;
  }
  else {
    iVar1 = atoi(argv[2]);
    uVar11 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),iVar1 == 0);
  }
  uVar13 = 0;
  uVar14 = 0;
  if (3 < argc) {
    dVar15 = atof(argv[3]);
    uVar13 = SUB84(dVar15,0);
    uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
  }
  local_120 = (double)CONCAT44(uVar14,uVar13);
  puts("\nConserved Exponential Entropy problem:");
  pcVar8 = "   method     = DIRK";
  cVar10 = (char)uVar11;
  if (cVar10 != '\0') {
    pcVar8 = "   method     = ERK";
  }
  puts(pcVar8);
  printf("   reltol     = %.1e\n",0xa0b5ed8d);
  printf("   abstol     = %.1e\n",0xd9d7bdbb);
  if (0.0 < local_120) {
    printf("   fixed h    = %.1e\n",SUB84(local_120,0));
  }
  pcVar8 = "   relaxation = ON";
  if ((char)uVar12 != '\0') {
    pcVar8 = "   relaxation = OFF";
  }
  puts(pcVar8);
  putchar(10);
  uVar2 = SUNContext_Create(0,&local_110);
  if ((int)uVar2 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(2,local_110);
    if (y == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    pdVar3 = (double *)N_VGetArrayPointer(y);
    if (pdVar3 == (double *)0x0) {
      main_cold_6();
      return 1;
    }
    *(undefined4 *)pdVar3 = 0;
    *(undefined4 *)((long)pdVar3 + 4) = 0x3ff00000;
    *(undefined4 *)(pdVar3 + 1) = 0;
    *(undefined4 *)((long)pdVar3 + 0xc) = 0x3fe00000;
    p_Var4 = (N_Vector)N_VClone(y);
    if (p_Var4 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    pdVar5 = (double *)N_VGetArrayPointer(p_Var4);
    if (pdVar5 == (double *)0x0) {
      main_cold_4();
      return 1;
    }
    if (cVar10 == '\0') {
      pcVar7 = f;
      pcVar9 = (code *)0x0;
    }
    else {
      pcVar9 = f;
      pcVar7 = (code *)0x0;
    }
    local_128 = ARKStepCreate(0,pcVar9,pcVar7,y,local_110);
    if (local_128 == 0) {
      main_cold_3();
      return 1;
    }
    uVar2 = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,local_128);
    if ((int)uVar2 < 0) {
      pcVar8 = "ARKodeSStolerances";
    }
    else if (((char)uVar12 == '\0') &&
            (uVar2 = ARKodeSetRelaxFn(local_128,Ent,JacEnt), (int)uVar2 < 0)) {
      pcVar8 = "ARKodeSetRelaxFn";
    }
    else {
      local_fc = uVar11;
      if (cVar10 == '\0') {
        lVar6 = SUNDenseMatrix(2,2,local_110);
        if (lVar6 == 0) {
          main_cold_2();
          return 1;
        }
        local_f8 = SUNLinSol_Dense(y,lVar6,local_110);
        if (local_f8 == 0) {
          main_cold_1();
          return 1;
        }
        uVar2 = ARKodeSetLinearSolver(local_128,local_f8,lVar6);
        if ((int)uVar2 < 0) {
          pcVar8 = "ARKodeSetLinearSolver";
          goto LAB_0010312f;
        }
        uVar2 = ARKodeSetJacFn(local_128,Jac);
        if ((int)uVar2 < 0) {
          pcVar8 = "ARKodeSetJacFn";
          goto LAB_0010312f;
        }
        uVar2 = ARKStepSetTableName(local_128,"ARKODE_ARK2_DIRK_3_1_2","ARKODE_ERK_NONE");
        if ((int)uVar2 < 0) {
          pcVar8 = "ARKStepSetTableName";
          goto LAB_0010312f;
        }
        uVar2 = ARKodeSetNonlinConvCoef(0x47ae147b,local_128);
        if ((int)uVar2 < 0) {
          pcVar8 = "ARKodeSetNonlinConvCoef";
          goto LAB_0010312f;
        }
      }
      else {
        local_f8 = 0;
        lVar6 = 0;
      }
      if ((local_120 <= 0.0) ||
         (uVar2 = ARKodeSetFixedStep(SUB84(local_120,0),local_128), -1 < (int)uVar2)) {
        local_e8 = p_Var4;
        local_e0 = lVar6;
        local_d8 = uVar12;
        __s = fopen("ark_conserved_exp_entropy_ark.txt","w");
        fwrite("# vars: t u v entropy u_err v_err entropy_error\n",0x30,1,__s);
        local_118 = 0.0;
        Ent(y,&local_38,user_data);
        local_f0 = local_38;
        fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e %23.16e %23.16e\n",0,*pdVar3,pdVar3[1],
                local_38,0,0,0);
        puts(" step   t              u              v              e              delta e");
        puts(" -------------------------------------------------------------------------------");
        printf("%5d %14.6e %14.6e %14.6e %14.6e %14.6e\n",SUB84(local_118,0),*pdVar3,pdVar3[1],
               local_f0,0,0);
        do {
          if (5.0 <= local_118) {
LAB_00102b66:
            puts(" -------------------------------------------------------------------------------")
            ;
            fclose(__s);
            uVar2 = ARKodeGetNumSteps(local_128,&local_108);
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumSteps",(ulong)uVar2);
            }
            uVar2 = ARKodeGetNumStepAttempts(local_128,&local_48);
            lVar6 = local_e0;
            uVar11 = local_fc;
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumStepAttempts",(ulong)uVar2);
            }
            uVar2 = ARKodeGetNumErrTestFails(local_128,&local_b8);
            uVar12 = local_d8;
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumErrTestFails",(ulong)uVar2);
            }
            uVar2 = ARKStepGetNumRhsEvals(local_128,&local_50,&local_58);
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKStepGetNumRhsEvals",(ulong)uVar2);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li (attempted = %li)\n",local_108,local_48);
            printf("   Total number of error test failures = %li\n",local_b8);
            printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_50,local_58);
            if ((char)uVar11 == '\0') {
              uVar2 = ARKodeGetNumNonlinSolvIters(local_128,&local_a8);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumNonlinSolvIters",
                        (ulong)uVar2);
              }
              uVar2 = ARKodeGetNumNonlinSolvConvFails(local_128,&local_b0);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumNonlinSolvConvFails",
                        (ulong)uVar2);
              }
              uVar2 = ARKodeGetNumLinSolvSetups(local_128,&local_90);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumLinSolvSetups",(ulong)uVar2
                       );
              }
              uVar2 = ARKodeGetNumJacEvals(local_128,&local_98);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumJacEvals",(ulong)uVar2);
              }
              uVar2 = ARKodeGetNumLinRhsEvals(local_128,&local_a0);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumLinRhsEvals",(ulong)uVar2);
              }
              printf("   Total number of Newton iterations = %li\n",local_a8);
              printf("   Total number of linear solver convergence failures = %li\n",local_b0);
              printf("   Total linear solver setups = %li\n",local_90);
              printf("   Total number of Jacobian evaluations = %li\n",local_98);
              printf("   Total RHS evals for setting up the linear system = %li\n",local_a0);
            }
            if ((char)uVar12 == '\0') {
              uVar2 = ARKodeGetNumRelaxFnEvals(local_128,&local_70);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxFnEvals",(ulong)uVar2)
                ;
              }
              uVar2 = ARKodeGetNumRelaxJacEvals(local_128,&local_78);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxJacEvals",(ulong)uVar2
                       );
              }
              uVar2 = ARKodeGetNumRelaxFails(local_128,&local_60);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxFails",(ulong)uVar2);
              }
              uVar2 = ARKodeGetNumRelaxBoundFails(local_128,&local_68);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxBoundFails",
                        (ulong)uVar2);
              }
              uVar2 = ARKodeGetNumRelaxSolveFails(local_128,&local_88);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxSolveFails",
                        (ulong)uVar2);
              }
              uVar2 = ARKodeGetNumRelaxSolveIters(local_128,&local_80);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxSolveIters",
                        (ulong)uVar2);
              }
              printf("   Total Relaxation Fn evals    = %li\n",local_70);
              printf("   Total Relaxation Jac evals   = %li\n",local_78);
              printf("   Total Relaxation fails       = %li\n",local_60);
              printf("   Total Relaxation bound fails = %li\n",local_68);
              printf("   Total Relaxation NLS fails   = %li\n",local_88);
              printf("   Total Relaxation NLS iters   = %li\n",local_80);
            }
            putchar(10);
            ARKodeFree(&local_128);
            SUNLinSolFree(local_f8);
            SUNMatDestroy(lVar6);
            N_VDestroy(y);
            N_VDestroy(local_e8);
            SUNContext_Free(&local_110);
            return uVar2;
          }
          uVar2 = ARKodeEvolve(local_128,y,&local_118,2);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeEvolve",(ulong)uVar2);
            goto LAB_00102b66;
          }
          Ent(y,&local_40,user_data_00);
          ans(local_118,local_e8);
          local_120 = local_40;
          local_c0 = *pdVar3 - *pdVar5;
          local_c8 = pdVar3[1] - pdVar5[1];
          uVar2 = ARKodeGetNumSteps(local_128,&local_108);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumSteps",(ulong)uVar2);
          }
          dVar15 = local_120 - local_f0;
          if ((local_108 * -0x3333333333333333 + 0x1999999999999998U >> 3 |
              local_108 * -0x3333333333333333 << 0x3d) < 0x666666666666667) {
            local_d0 = dVar15;
            printf("%5ld %14.6e %14.6e %14.6e %14.6e %14.6e\n",SUB84(local_118,0),*pdVar3,pdVar3[1],
                   local_120,dVar15);
            dVar15 = local_d0;
          }
          fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e %23.16e %23.16e\n",SUB84(local_118,0)
                  ,*pdVar3,pdVar3[1],local_120,local_c0,local_c8,dVar15);
        } while( true );
      }
      pcVar8 = "ARKodeSetFixedStep";
    }
  }
LAB_0010312f:
  fprintf(_stderr,"ERROR: %s() returned %d\n",pcVar8,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Error-checking flag */
  int flag;

  /* Initial and final times */
  sunrealtype t0 = SUN_RCONST(0.0);
  sunrealtype tf = SUN_RCONST(5.0);

  /* Relative and absolute tolerances */
  sunrealtype reltol = SUN_RCONST(1.0e-6);
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* SUNDIALS context, vector, matrix, and linear solver objects */
  SUNContext ctx     = NULL;
  N_Vector y         = NULL;
  N_Vector ytrue     = NULL;
  SUNMatrix A        = NULL;
  SUNLinearSolver LS = NULL;

  /* Pointer to vector data array */
  sunrealtype* ydata;
  sunrealtype* ytdata;

  /* Initial, current, and change in entropy value */
  sunrealtype ent0, ent, ent_err;

  /* Solution errors */
  sunrealtype u_err, v_err;

  /* ARKODE memory structure */
  void* arkode_mem = NULL;

  /* ARKODE statistics */
  long int nst, nst_a, nfe, nfi;
  long int nrf, nrbf, nre, nrje, nrnlsi, nrnlsf;
  long int nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Output time and file */
  sunrealtype t;
  FILE* UFID;

  /* Command line options */
  int relax           = 1;               /* enable relaxation */
  int implicit        = 1;               /* implicit          */
  sunrealtype fixed_h = SUN_RCONST(0.0); /* adaptive stepping */

  /* -------------------- *
   * Output Problem Setup *
   * -------------------- */

  if (argc > 1) { relax = atoi(argv[1]); }
  if (argc > 2) { implicit = atoi(argv[2]); }
  if (argc > 3) { fixed_h = atof(argv[3]); }

  printf("\nConserved Exponential Entropy problem:\n");
  if (implicit) { printf("   method     = DIRK\n"); }
  else { printf("   method     = ERK\n"); }
  printf("   reltol     = %.1" ESYM "\n", reltol);
  printf("   abstol     = %.1" ESYM "\n", abstol);
  if (fixed_h > SUN_RCONST(0.0))
  {
    printf("   fixed h    = %.1" ESYM "\n", fixed_h);
  }
  if (relax) { printf("   relaxation = ON\n"); }
  else { printf("   relaxation = OFF\n"); }
  printf("\n");

  /* ------------ *
   * Setup ARKODE *
   * ------------ */

  /* Create the SUNDIALS context object for this simulation */
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(flag, "SUNContext_Create")) { return 1; }

  /* Create serial vector and set the initial condition values */
  y = N_VNew_Serial(2, ctx);
  if (check_ptr(y, "N_VNew_Serial")) { return 1; }

  ydata = N_VGetArrayPointer(y);
  if (check_ptr(ydata, "N_VGetArrayPointer")) { return 1; }

  ydata[0] = SUN_RCONST(1.0);
  ydata[1] = SUN_RCONST(0.5);

  ytrue = N_VClone(y);
  if (check_ptr(ytrue, "N_VClone")) { return 1; }

  ytdata = N_VGetArrayPointer(ytrue);
  if (check_ptr(ytdata, "N_VGetArrayPointer")) { return 1; }

  /* Initialize ARKStep */
  if (implicit) { arkode_mem = ARKStepCreate(NULL, f, t0, y, ctx); }
  else { arkode_mem = ARKStepCreate(f, NULL, t0, y, ctx); }
  if (check_ptr(arkode_mem, "ARKStepCreate")) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(flag, "ARKodeSStolerances")) { return 1; }

  if (relax)
  {
    /* Enable relaxation methods */
    flag = ARKodeSetRelaxFn(arkode_mem, Ent, JacEnt);
    if (check_flag(flag, "ARKodeSetRelaxFn")) { return 1; }
  }

  if (implicit)
  {
    /* Create dense matrix and linear solver */
    A = SUNDenseMatrix(2, 2, ctx);
    if (check_ptr(A, "SUNDenseMatrix")) { return 1; }

    LS = SUNLinSol_Dense(y, A, ctx);
    if (check_ptr(LS, "SUNLinSol_Dense")) { return 1; }

    /* Attach the matrix and linear solver */
    flag = ARKodeSetLinearSolver(arkode_mem, LS, A);
    if (check_flag(flag, "ARKodeSetLinearSolver")) { return 1; }

    /* Set Jacobian routine */
    flag = ARKodeSetJacFn(arkode_mem, Jac);
    if (check_flag(flag, "ARKodeSetJacFn")) { return 1; }

    /* Select a Butcher table with non-negative b values */
    flag = ARKStepSetTableName(arkode_mem, "ARKODE_ARK2_DIRK_3_1_2",
                               "ARKODE_ERK_NONE");
    if (check_flag(flag, "ARKStepSetTableName")) { return 1; }

    /* Tighten nonlinear solver tolerance */
    flag = ARKodeSetNonlinConvCoef(arkode_mem, SUN_RCONST(0.01));
    if (check_flag(flag, "ARKodeSetNonlinConvCoef")) { return 1; }
  }

  if (fixed_h > SUN_RCONST(0.0))
  {
    flag = ARKodeSetFixedStep(arkode_mem, fixed_h);
    if (check_flag(flag, "ARKodeSetFixedStep")) { return 1; }
  }

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_conserved_exp_entropy_ark.txt", "w");
  fprintf(UFID, "# vars: t u v entropy u_err v_err entropy_error\n");

  /* --------------- *
   * Advance in Time *
   * --------------- */

  /* Initial time */
  t = t0;

  /* Output the initial condition and entropy */
  flag = Ent(y, &ent0, NULL);
  if (check_flag(flag, "Ent")) { return 1; }

  fprintf(UFID,
          "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
          " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM "\n",
          t0, ydata[0], ydata[1], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0),
          SUN_RCONST(0.0));

  printf(" step   t              u              v              e            "
         "  delta e\n");
  printf(" --------------------------------------------------------------------"
         "-----------\n");
  printf("%5d %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
         " %14.6" ESYM "\n",
         0, t, ydata[0], ydata[1], ent0, SUN_RCONST(0.0));

  while (t < tf)
  {
    /* Evolve in time */
    flag = ARKodeEvolve(arkode_mem, tf, y, &t, ARK_ONE_STEP);
    if (check_flag(flag, "ARKodeEvolve")) { break; }

    /* Output solution and errors */
    flag = Ent(y, &ent, NULL);
    if (check_flag(flag, "Ent")) { return 1; }

    flag = ans(t, ytrue);
    if (check_flag(flag, "ans")) { return 1; }

    ent_err = ent - ent0;
    u_err   = ydata[0] - ytdata[0];
    v_err   = ydata[1] - ytdata[1];

    /* Output to the screen periodically */
    flag = ARKodeGetNumSteps(arkode_mem, &nst);
    check_flag(flag, "ARKodeGetNumSteps");

    if (nst % 40 == 0)
    {
      printf("%5ld %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
             " %14.6" ESYM "\n",
             nst, t, ydata[0], ydata[1], ent, ent_err);
    }

    /* Write all steps to file */
    fprintf(UFID,
            "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
            " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM "\n",
            t, ydata[0], ydata[1], ent, u_err, v_err, ent_err);
  }

  printf(" --------------------------------------------------------------------"
         "-----------\n");
  fclose(UFID);

  /* ------------ *
   * Output Stats *
   * ------------ */

  /* Get final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(flag, "ARKodeGetNumSteps");

  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(flag, "ARKodeGetNumStepAttempts");

  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(flag, "ARKodeGetNumErrTestFails");

  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(flag, "ARKStepGetNumRhsEvals");

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);

  if (implicit)
  {
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    check_flag(flag, "ARKodeGetNumNonlinSolvIters");

    flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
    check_flag(flag, "ARKodeGetNumNonlinSolvConvFails");

    flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
    check_flag(flag, "ARKodeGetNumLinSolvSetups");

    flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
    check_flag(flag, "ARKodeGetNumJacEvals");

    flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
    check_flag(flag, "ARKodeGetNumLinRhsEvals");

    printf("   Total number of Newton iterations = %li\n", nni);
    printf("   Total number of linear solver convergence failures = %li\n", ncfn);
    printf("   Total linear solver setups = %li\n", nsetups);
    printf("   Total number of Jacobian evaluations = %li\n", nje);
    printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  }

  if (relax)
  {
    flag = ARKodeGetNumRelaxFnEvals(arkode_mem, &nre);
    check_flag(flag, "ARKodeGetNumRelaxFnEvals");

    flag = ARKodeGetNumRelaxJacEvals(arkode_mem, &nrje);
    check_flag(flag, "ARKodeGetNumRelaxJacEvals");

    flag = ARKodeGetNumRelaxFails(arkode_mem, &nrf);
    check_flag(flag, "ARKodeGetNumRelaxFails");

    flag = ARKodeGetNumRelaxBoundFails(arkode_mem, &nrbf);
    check_flag(flag, "ARKodeGetNumRelaxBoundFails");

    flag = ARKodeGetNumRelaxSolveFails(arkode_mem, &nrnlsf);
    check_flag(flag, "ARKodeGetNumRelaxSolveFails");

    flag = ARKodeGetNumRelaxSolveIters(arkode_mem, &nrnlsi);
    check_flag(flag, "ARKodeGetNumRelaxSolveIters");

    printf("   Total Relaxation Fn evals    = %li\n", nre);
    printf("   Total Relaxation Jac evals   = %li\n", nrje);
    printf("   Total Relaxation fails       = %li\n", nrf);
    printf("   Total Relaxation bound fails = %li\n", nrbf);
    printf("   Total Relaxation NLS fails   = %li\n", nrnlsf);
    printf("   Total Relaxation NLS iters   = %li\n", nrnlsi);
  }
  printf("\n");

  /* -------- *
   * Clean up *
   * -------- */

  /* Free ARKode integrator and SUNDIALS objects */
  ARKodeFree(&arkode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(y);
  N_VDestroy(ytrue);
  SUNContext_Free(&ctx);

  return flag;
}